

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<int,_Js::AsmJsVarBase_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
::Initialize(BaseDictionary<int,_Js::AsmJsVarBase_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             *this,int capacity)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  DictionaryStats *pDVar5;
  uint bucketCount;
  uint bucketCount_00;
  int *local_40;
  int *newBuckets;
  EntryType *newEntries;
  
  bucketCount_00 = 4;
  bucketCount = 4;
  if (4 < capacity) {
    bucketCount = capacity;
  }
  if ((8 < capacity) &&
     (bucketCount_00 = bucketCount + 1 >> 1, (bucketCount_00 - 1 & bucketCount_00) != 0)) {
    iVar1 = 0x1f;
    if (bucketCount_00 != 0) {
      for (; bucketCount_00 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    bucketCount_00 = 1 << (-((byte)iVar1 ^ 0x1f) & 0x1f);
  }
  local_40 = (Type)0x0;
  newBuckets = (int *)0x0;
  Allocate(this,&local_40,(EntryType **)&newBuckets,bucketCount_00,bucketCount);
  this->buckets = local_40;
  this->entries = (Type)newBuckets;
  this->bucketCount = bucketCount_00;
  this->size = bucketCount;
  this->modFunctionIndex = 0x4b;
  if (this->freeCount != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                       ,0x38c,"(this->freeCount == 0)","this->freeCount == 0");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
    bucketCount = this->size;
  }
  pDVar5 = DictionaryStats::Create
                     ("PN6JsUtil14BaseDictionaryIiPN2Js12AsmJsVarBaseEN6Memory14ArenaAllocatorE20DictionarySizePolicyI14PowerOf2PolicyLj2ELj2ELj1ELj4EE15DefaultComparerNS_21SimpleDictionaryEntryENS_12NoResizeLockEEE"
                      ,bucketCount);
  this->stats = pDVar5;
  return;
}

Assistant:

void Initialize(int capacity)
        {
            // minimum capacity is 4
            int initSize = max(capacity, 4);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint initBucketCount = SizePolicy::GetBucketSize(initSize, &modIndex);
            AssertMsg(initBucketCount > 0, "Size returned by policy should be greater than 0");

            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            Allocate(&newBuckets, &newEntries, initBucketCount, initSize);

            // Allocation can throw - assign only after allocation has succeeded.
            this->buckets = newBuckets;
            this->entries = newEntries;
            this->bucketCount = initBucketCount;
            this->size = initSize;
            this->modFunctionIndex = modIndex;
            Assert(this->freeCount == 0);
#if PROFILE_DICTIONARY
            stats = DictionaryStats::Create(typeid(this).name(), size);
#endif
        }